

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.h
# Opt level: O3

bool __thiscall
brotli::HashLongestMatchQuickly<16,_2,_false>::FindLongestMatch
          (HashLongestMatchQuickly<16,_2,_false> *this,uint8_t *ring_buffer,size_t ring_buffer_mask,
          int *distance_cache,size_t cur_ix,size_t max_length,size_t max_backward,
          size_t *best_len_out,size_t *best_len_code_out,size_t *best_distance_out,
          double *best_score_out)

{
  uint8_t *puVar1;
  int iVar2;
  long lVar3;
  bool bVar4;
  bool bVar5;
  ulong uVar6;
  ulong uVar7;
  uint32_t *puVar8;
  long lVar9;
  ulong uVar10;
  uint8_t uVar11;
  ulong uVar12;
  ulong uVar13;
  uint8_t *puVar14;
  uint uVar15;
  ulong uVar16;
  bool bVar17;
  uint uVar18;
  ulong uVar19;
  double dVar20;
  undefined1 auVar21 [16];
  double dVar22;
  undefined1 auVar23 [16];
  
  uVar7 = *best_len_out;
  lVar3 = *(long *)(ring_buffer + (cur_ix & ring_buffer_mask));
  puVar1 = ring_buffer + (cur_ix & ring_buffer_mask);
  uVar11 = puVar1[uVar7];
  dVar20 = *best_score_out;
  iVar2 = *distance_cache;
  uVar19 = cur_ix - (long)iVar2;
  if ((uVar19 < cur_ix) &&
     (uVar18 = (uint)uVar19 & (uint)ring_buffer_mask, uVar11 == ring_buffer[uVar7 + uVar18])) {
    if (7 < max_length) {
      uVar19 = max_length & 0xfffffffffffffff8;
      puVar14 = puVar1 + uVar19;
      lVar9 = 0;
      uVar13 = 0;
LAB_0012087a:
      if (*(ulong *)(puVar1 + uVar13 * 8) == *(ulong *)(ring_buffer + uVar13 * 8 + (ulong)uVar18))
      goto code_r0x00120888;
      uVar13 = *(ulong *)(ring_buffer + uVar13 * 8 + (ulong)uVar18) ^
               *(ulong *)(puVar1 + uVar13 * 8);
      uVar19 = 0;
      if (uVar13 != 0) {
        for (; (uVar13 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
        }
      }
      uVar13 = (uVar19 >> 3 & 0x1fffffff) - lVar9;
      goto LAB_001208c9;
    }
    uVar19 = 0;
    puVar14 = puVar1;
LAB_00120afd:
    uVar16 = max_length & 7;
    uVar13 = uVar19;
    if (uVar16 != 0) {
      uVar12 = uVar19 | uVar16;
      do {
        uVar13 = uVar19;
        if (ring_buffer[uVar19 + uVar18] != *puVar14) break;
        puVar14 = puVar14 + 1;
        uVar19 = uVar19 + 1;
        uVar16 = uVar16 - 1;
        uVar13 = uVar12;
      } while (uVar16 != 0);
    }
LAB_001208c9:
    if (3 < uVar13) {
      auVar21._8_4_ = (int)(uVar13 >> 0x20);
      auVar21._0_8_ = uVar13;
      auVar21._12_4_ = 0x45300000;
      dVar20 = ((auVar21._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar13) - 4503599627370496.0)) * 5.4 + 0.6;
      *best_len_out = uVar13;
      *best_len_code_out = uVar13;
      *best_distance_out = (long)iVar2;
      *best_score_out = dVar20;
      uVar11 = puVar1[uVar13];
      bVar5 = true;
      uVar7 = uVar13;
      goto LAB_00120939;
    }
  }
  bVar5 = false;
LAB_00120939:
  puVar8 = this->buckets_ + ((ulong)(lVar3 * 0x1e35a7bd000000) >> 0x30);
  uVar19 = (ulong)((uint)max_length & 7);
  bVar17 = true;
  do {
    uVar18 = *puVar8;
    uVar15 = uVar18 & (uint)ring_buffer_mask;
    if (((uVar11 == ring_buffer[uVar7 + uVar15]) && (cur_ix != uVar18)) &&
       (uVar13 = cur_ix - uVar18, uVar13 <= max_backward)) {
      if (7 < max_length) {
        lVar9 = 0;
        uVar16 = 0;
LAB_001209d5:
        if (*(ulong *)(puVar1 + uVar16 * 8) == *(ulong *)(ring_buffer + uVar16 * 8 + (ulong)uVar15))
        goto code_r0x001209e2;
        uVar12 = *(ulong *)(ring_buffer + uVar16 * 8 + (ulong)uVar15) ^
                 *(ulong *)(puVar1 + uVar16 * 8);
        uVar16 = 0;
        if (uVar12 != 0) {
          for (; (uVar12 >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
          }
        }
        uVar16 = (uVar16 >> 3 & 0x1fffffff) - lVar9;
        goto LAB_00120a0d;
      }
      puVar14 = puVar1;
      uVar12 = 0;
LAB_00120a95:
      uVar16 = uVar12;
      if (uVar19 != 0) {
        uVar6 = uVar12 | uVar19;
        uVar10 = uVar19;
        do {
          uVar16 = uVar12;
          if (ring_buffer[uVar12 + uVar15] != *puVar14) break;
          puVar14 = puVar14 + 1;
          uVar12 = uVar12 + 1;
          uVar10 = uVar10 - 1;
          uVar16 = uVar6;
        } while (uVar10 != 0);
      }
LAB_00120a0d:
      if (3 < uVar16) {
        auVar23._8_4_ = (int)(uVar16 >> 0x20);
        auVar23._0_8_ = uVar16;
        auVar23._12_4_ = 0x45300000;
        iVar2 = 0x1f;
        if ((uint)uVar13 != 0) {
          for (; (uint)uVar13 >> iVar2 == 0; iVar2 = iVar2 + -1) {
          }
        }
        dVar22 = ((auVar23._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar16) - 4503599627370496.0)) * 5.4 +
                 (double)iVar2 * -1.2;
        if (dVar20 < dVar22) {
          *best_len_out = uVar16;
          *best_len_code_out = uVar16;
          *best_distance_out = uVar13;
          *best_score_out = dVar22;
          uVar11 = puVar1[uVar16];
          bVar5 = true;
          uVar7 = uVar16;
          dVar20 = dVar22;
        }
      }
    }
    puVar8 = puVar8 + 1;
    bVar4 = !bVar17;
    bVar17 = false;
    if (bVar4) {
      *(uint *)((long)this->buckets_ +
               (ulong)(((uint)(ushort)((ulong)(lVar3 * 0x1e35a7bd000000) >> 0x30) +
                       (uint)(((uint)cur_ix >> 3 & 1) != 0)) * 4)) = (uint)cur_ix;
      return bVar5;
    }
  } while( true );
code_r0x00120888:
  uVar13 = uVar13 + 1;
  lVar9 = lVar9 + -8;
  if (max_length >> 3 == uVar13) goto LAB_00120afd;
  goto LAB_0012087a;
code_r0x001209e2:
  uVar16 = uVar16 + 1;
  lVar9 = lVar9 + -8;
  puVar14 = puVar1 + (max_length & 0xfffffffffffffff8);
  uVar12 = max_length & 0xfffffffffffffff8;
  if (max_length >> 3 == uVar16) goto LAB_00120a95;
  goto LAB_001209d5;
}

Assistant:

inline bool FindLongestMatch(const uint8_t * __restrict ring_buffer,
                               const size_t ring_buffer_mask,
                               const int* __restrict distance_cache,
                               const size_t cur_ix,
                               const size_t max_length,
                               const size_t max_backward,
                               size_t * __restrict best_len_out,
                               size_t * __restrict best_len_code_out,
                               size_t * __restrict best_distance_out,
                               double* __restrict best_score_out) {
    const size_t best_len_in = *best_len_out;
    const size_t cur_ix_masked = cur_ix & ring_buffer_mask;
    const uint32_t key = HashBytes(&ring_buffer[cur_ix_masked]);
    int compare_char = ring_buffer[cur_ix_masked + best_len_in];
    double best_score = *best_score_out;
    size_t best_len = best_len_in;
    size_t cached_backward = static_cast<size_t>(distance_cache[0]);
    size_t prev_ix = cur_ix - cached_backward;
    bool match_found = false;
    if (prev_ix < cur_ix) {
      prev_ix &= static_cast<uint32_t>(ring_buffer_mask);
      if (compare_char == ring_buffer[prev_ix + best_len]) {
        size_t len = FindMatchLengthWithLimit(&ring_buffer[prev_ix],
                                              &ring_buffer[cur_ix_masked],
                                              max_length);
        if (len >= 4) {
          best_score = BackwardReferenceScoreUsingLastDistance(len, 0);
          best_len = len;
          *best_len_out = len;
          *best_len_code_out = len;
          *best_distance_out = cached_backward;
          *best_score_out = best_score;
          compare_char = ring_buffer[cur_ix_masked + best_len];
          if (kBucketSweep == 1) {
            buckets_[key] = static_cast<uint32_t>(cur_ix);
            return true;
          } else {
            match_found = true;
          }
        }
      }
    }
    if (kBucketSweep == 1) {
      // Only one to look for, don't bother to prepare for a loop.
      prev_ix = buckets_[key];
      buckets_[key] = static_cast<uint32_t>(cur_ix);
      size_t backward = cur_ix - prev_ix;
      prev_ix &= static_cast<uint32_t>(ring_buffer_mask);
      if (compare_char != ring_buffer[prev_ix + best_len_in]) {
        return false;
      }
      if (PREDICT_FALSE(backward == 0 || backward > max_backward)) {
        return false;
      }
      const size_t len = FindMatchLengthWithLimit(&ring_buffer[prev_ix],
                                                  &ring_buffer[cur_ix_masked],
                                                  max_length);
      if (len >= 4) {
        *best_len_out = len;
        *best_len_code_out = len;
        *best_distance_out = backward;
        *best_score_out = BackwardReferenceScore(len, backward);
        return true;
      }
    } else {
      uint32_t *bucket = buckets_ + key;
      prev_ix = *bucket++;
      for (int i = 0; i < kBucketSweep; ++i, prev_ix = *bucket++) {
        const size_t backward = cur_ix - prev_ix;
        prev_ix &= static_cast<uint32_t>(ring_buffer_mask);
        if (compare_char != ring_buffer[prev_ix + best_len]) {
          continue;
        }
        if (PREDICT_FALSE(backward == 0 || backward > max_backward)) {
          continue;
        }
        const size_t len = FindMatchLengthWithLimit(&ring_buffer[prev_ix],
                                                    &ring_buffer[cur_ix_masked],
                                                    max_length);
        if (len >= 4) {
          const double score = BackwardReferenceScore(len, backward);
          if (best_score < score) {
            best_score = score;
            best_len = len;
            *best_len_out = best_len;
            *best_len_code_out = best_len;
            *best_distance_out = backward;
            *best_score_out = score;
            compare_char = ring_buffer[cur_ix_masked + best_len];
            match_found = true;
          }
        }
      }
    }
    if (kUseDictionary && !match_found &&
        num_dict_matches_ >= (num_dict_lookups_ >> 7)) {
      ++num_dict_lookups_;
      const uint32_t dict_key = Hash<14>(&ring_buffer[cur_ix_masked]) << 1;
      const uint16_t v = kStaticDictionaryHash[dict_key];
      if (v > 0) {
        const uint32_t len = v & 31;
        const uint32_t dist = v >> 5;
        const size_t offset =
            kBrotliDictionaryOffsetsByLength[len] + len * dist;
        if (len <= max_length) {
          const size_t matchlen =
              FindMatchLengthWithLimit(&ring_buffer[cur_ix_masked],
                                       &kBrotliDictionary[offset], len);
          if (matchlen + kCutoffTransformsCount > len && matchlen > 0) {
            const size_t transform_id = kCutoffTransforms[len - matchlen];
            const size_t word_id =
                transform_id * (1 << kBrotliDictionarySizeBitsByLength[len]) +
                dist;
            const size_t backward = max_backward + word_id + 1;
            const double score = BackwardReferenceScore(matchlen, backward);
            if (best_score < score) {
              ++num_dict_matches_;
              best_score = score;
              best_len = matchlen;
              *best_len_out = best_len;
              *best_len_code_out = len;
              *best_distance_out = backward;
              *best_score_out = best_score;
              match_found = true;
            }
          }
        }
      }
    }
    const uint32_t off = (cur_ix >> 3) % kBucketSweep;
    buckets_[key + off] = static_cast<uint32_t>(cur_ix);
    return match_found;
  }